

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

int needa(char **p,char *c1,int r1,char *c2,int r2,char *c3,int r3,bool allowParenthesisEnd)

{
  int iVar1;
  
  iVar1 = isalpha((uint)(byte)**p);
  if ((iVar1 == 0) ||
     (((iVar1 = cmphstr(p,c1,allowParenthesisEnd), iVar1 == 0 &&
       ((c2 == (char *)0x0 || (iVar1 = cmphstr(p,c2,allowParenthesisEnd), r1 = r2, iVar1 == 0)))) &&
      ((c3 == (char *)0x0 || (iVar1 = cmphstr(p,c3,allowParenthesisEnd), r1 = r3, iVar1 == 0)))))) {
    r1 = 0;
  }
  return r1;
}

Assistant:

int needa(char*& p, const char* c1, int r1, const char* c2, int r2, const char* c3, int r3, bool allowParenthesisEnd) {
	//  SkipBlanks(p);
	if (!isalpha((byte)*p)) {
		return 0;
	}
	if (cmphstr(p, c1, allowParenthesisEnd)) {
		return r1;
	}
	if (c2 && cmphstr(p, c2, allowParenthesisEnd)) {
		return r2;
	}
	if (c3 && cmphstr(p, c3, allowParenthesisEnd)) {
		return r3;
	}
	return 0;
}